

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotecache.h
# Opt level: O1

bool __thiscall
snmalloc::RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
::post<11008ul>(RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                *this,LocalState *param_1,alloc_id_t id)

{
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> *pRVar1
  ;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>> *pRVar2
  ;
  ulong *puVar3;
  code *pcVar4;
  address_t aVar5;
  address_t aVar6;
  address_t aVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  address_t n;
  ulong *puVar13;
  long lVar14;
  ulong uVar15;
  address_t c_3;
  char cVar16;
  
  bVar8 = false;
  cVar16 = '\0';
  do {
    uVar12 = id >> (cVar16 * '\b' + 0xeU & 0x3f) & 0xff;
    lVar9 = 0;
    do {
      if (((ulong)(uint)((int)uVar12 * 8) * 3 != lVar9) &&
         (pRVar1 = this + lVar9,
         pRVar1 != *(RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                     **)(this + lVar9 + 8))) {
        uVar10 = RemoteAllocator::key_global.key_next ^ *(ulong *)pRVar1;
        *(RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
          **)(pRVar1 + 8) = pRVar1;
        *(ulong *)pRVar1 = uVar10;
        uVar10 = *(ulong *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                     ::concretePagemap.body)->
                                   super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                                   ).super_MetaEntryBase.remote_and_sizeclass +
                           (uVar10 >> 10 & 0xfffffffffffffff0));
        if ((char)uVar10 < '\0') goto LAB_00108e0a;
        FreeListMPSCQ<snmalloc::RemoteAllocator::key_global,0ul>::
        enqueue<snmalloc::RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::post<11008ul>(snmalloc::MetaProtectedRangeLocalState<snmalloc::PALLinux,snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>,snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>>::Type<snmalloc::PalRange<snmalloc::PALLinux>>>,14ul>*,unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_2_>
                  ((FreeListMPSCQ<snmalloc::RemoteAllocator::key_global,0ul> *)
                   (uVar10 & 0xffffffffffffff00));
        bVar8 = true;
      }
      aVar7 = RemoteAllocator::key_global.key_next;
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x1800);
    pRVar1 = this + uVar12 * 0x18;
    pRVar2 = *(RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
               **)(pRVar1 + 8);
    if (pRVar2 != pRVar1) {
      *(address_t *)pRVar2 = RemoteAllocator::key_global.key_next;
      aVar6 = RemoteAllocator::key_global.key2;
      aVar5 = RemoteAllocator::key_global.key1;
      *(RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
        **)(pRVar1 + 8) = pRVar1;
      cVar16 = cVar16 + '\x01';
      if (aVar7 != *(ulong *)pRVar1) {
        puVar11 = (ulong *)(aVar7 ^ *(ulong *)pRVar1);
        uVar12 = (long)(pRVar1 + aVar5) * (aVar6 + (long)puVar11);
        do {
          aVar7 = RemoteAllocator::key_global.key_next;
          uVar10 = *puVar11;
          puVar13 = (ulong *)(RemoteAllocator::key_global.key_next ^ uVar10);
          if (puVar11[1] != uVar12) {
LAB_00108e0a:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          lVar14 = (long)puVar13 + RemoteAllocator::key_global.key2;
          lVar9 = RemoteAllocator::key_global.key1 + (long)puVar11;
          *puVar11 = 0;
          puVar11[1] = 0;
          uVar12 = lVar9 * lVar14;
          uVar15 = (*(ulong *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                        ::concretePagemap.body)->
                                      super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                                      ).super_MetaEntryBase.remote_and_sizeclass +
                              ((ulong)puVar11 >> 10 & 0xfffffffffffffff0)) & 0xffffffffffffff80) >>
                   (cVar16 * '\b' + 0xeU & 0x3f) & 0xff;
          puVar3 = *(ulong **)(this + uVar15 * 0x18 + 8);
          puVar11[1] = (RemoteAllocator::key_global.key2 + (long)puVar11) *
                       (RemoteAllocator::key_global.key1 + (long)puVar3);
          *puVar3 = RemoteAllocator::key_global.key_next ^ (ulong)puVar11;
          *(ulong **)(this + uVar15 * 0x18 + 8) = puVar11;
          puVar11 = puVar13;
        } while (aVar7 != uVar10);
      }
    }
    if (pRVar2 == pRVar1) {
      *(undefined8 *)(this + 0x1808) = 0x4000;
      return bVar8;
    }
  } while( true );
}

Assistant:

bool post(
      typename Config::LocalState* local_state, RemoteAllocator::alloc_id_t id)
    {
      // Use same key as the remote allocator, so segments can be
      // posted to a remote allocator without reencoding.
      const auto& key = RemoteAllocator::key_global;
      SNMALLOC_ASSERT(initialised);
      size_t post_round = 0;
      bool sent_something = false;
      auto domesticate = [local_state](freelist::QueuePtr p)
                           SNMALLOC_FAST_PATH_LAMBDA {
                             return capptr_domesticate<Config>(local_state, p);
                           };

      batching.close_all([this](
                           RemoteAllocator::alloc_id_t target_id,
                           capptr::Alloc<RemoteMessage> msg) {
        forward<allocator_size>(target_id, msg);
      });

      while (true)
      {
        auto my_slot = get_slot<allocator_size>(id, post_round);

        for (size_t i = 0; i < REMOTE_SLOTS; i++)
        {
          if (i == my_slot)
            continue;

          if (!list[i].empty())
          {
            auto [first_, last_] = list[i].extract_segment(key, NO_KEY_TWEAK);
            auto first = RemoteMessage::from_message_link(first_);
            auto last = RemoteMessage::from_message_link(last_);
            const auto& entry =
              Config::Backend::get_metaentry(address_cast(first_));
            auto remote = entry.get_remote();
            // If the allocator is not correctly aligned, then the bit that is
            // set implies this is used by the backend, and we should not be
            // deallocating memory here.
            snmalloc_check_client(
              mitigations(sanity_checks),
              !entry.is_backend_owned(),
              "Delayed detection of attempt to free internal structure.");
            if constexpr (Config::Options.QueueHeadsAreTame)
            {
              auto domesticate_nop = [](freelist::QueuePtr p) {
                return freelist::HeadPtr::unsafe_from(p.unsafe_ptr());
              };
              remote->enqueue(first, last, domesticate_nop);
            }
            else
            {
              remote->enqueue(first, last, domesticate);
            }
            sent_something = true;
          }
        }

        if (list[my_slot].empty())
          break;

        // Entries could map back onto the "resend" list,
        // so take copy of the head, mark the last element,
        // and clear the original list.
        freelist::Iter<> resend;
        list[my_slot].close(resend, key, NO_KEY_TWEAK);

        post_round++;

        while (!resend.empty())
        {
          // Use the next N bits to spread out remote deallocs in our own
          // slot.
          auto r = resend.take(key, domesticate);
          const auto& entry = Config::Backend::get_metaentry(address_cast(r));
          auto i = entry.get_remote()->trunc_id();
          size_t slot = get_slot<allocator_size>(i, post_round);
          list[slot].add(r, key, NO_KEY_TWEAK);
        }
      }

      // Reset capacity as we have emptied everything
      capacity = REMOTE_CACHE;

      return sent_something;
    }